

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

void Acec_CheckBoothPPs(Gia_Man_t *p,Vec_Wec_t *vLitLeaves)

{
  uint uVar1;
  Vec_Bit_t *__ptr;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  __ptr = Acec_MultMarkPPs(p);
  if (0 < vLitLeaves->nSize) {
    uVar8 = 0;
    do {
      lVar3 = (long)vLitLeaves->pArray[uVar8].nSize;
      uVar2 = 0;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < lVar3) {
        lVar4 = 0;
        uVar6 = 0;
        uVar5 = 0;
        uVar2 = 0;
        do {
          uVar1 = vLitLeaves->pArray[uVar8].pArray[lVar4];
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar7 = uVar1 >> 1;
          if (p->nObjs <= (int)uVar7) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((int)*(uint *)(p->pObjs + uVar7) < 0 ||
              (~*(uint *)(p->pObjs + uVar7) & 0x1fffffff) == 0) {
            uVar2 = (ulong)((int)uVar2 + 1);
          }
          else {
            if (__ptr->nSize <= (int)uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)__ptr->pArray[uVar1 >> 6] >> (uVar7 & 0x1f) & 1) == 0) {
              uVar6 = (ulong)((int)uVar6 + 1);
            }
            else {
              uVar5 = (ulong)((int)uVar5 + 1);
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      printf("Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n",uVar8 & 0xffffffff,
             lVar3,uVar2,uVar5,uVar6);
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)vLitLeaves->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Acec_CheckBoothPPs( Gia_Man_t * p, Vec_Wec_t * vLitLeaves )
{
    Vec_Bit_t * vMarked = Acec_MultMarkPPs( p );
    Vec_Int_t * vLevel;
    int i, k, iLit;
    Vec_WecForEachLevel( vLitLeaves, vLevel, i )
    {
        int CountPI = 0, CountB = 0, CountNB = 0;
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                CountPI++;
            else if ( Vec_BitEntry( vMarked, Abc_Lit2Var(iLit) ) )
                CountB++;
            else
                CountNB++;

        printf( "Rank %2d : Lits = %5d    PI = %d  Booth = %5d  Non-Booth = %5d\n", i, Vec_IntSize(vLevel), CountPI, CountB, CountNB );
    }
    Vec_BitFree( vMarked );
}